

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

void cftf1st(int n,double *a,double *w)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double local_b8;
  
  iVar9 = n >> 3;
  lVar4 = (long)(iVar9 * 2);
  dVar16 = a[iVar9 * 4];
  dVar19 = (a + iVar9 * 4)[1];
  dVar24 = *a - dVar16;
  dVar26 = a[1] - dVar19;
  dVar28 = a[lVar4];
  dVar29 = (a + lVar4)[1];
  dVar32 = a[iVar9 * 6];
  dVar34 = (a + iVar9 * 6)[1];
  dVar31 = dVar28 - dVar32;
  dVar33 = dVar29 - dVar34;
  dVar16 = *a + dVar16;
  dVar19 = a[1] + dVar19;
  dVar28 = dVar28 + dVar32;
  dVar29 = dVar29 + dVar34;
  *a = dVar16 + dVar28;
  a[1] = dVar19 + dVar29;
  a[lVar4] = dVar16 - dVar28;
  (a + lVar4)[1] = dVar19 - dVar29;
  a[iVar9 * 4] = dVar24 - dVar33;
  (a + iVar9 * 4)[1] = dVar31 + dVar26;
  a[iVar9 * 6] = dVar33 + dVar24;
  (a + iVar9 * 6)[1] = dVar26 - dVar31;
  dVar16 = w[1];
  dVar19 = w[2];
  dVar28 = w[3];
  lVar6 = (long)(iVar9 + -2);
  lVar14 = lVar4 + -2;
  lVar13 = lVar4 * 0x10 + -0x10;
  lVar5 = lVar4 * 0x20 + -0x10;
  lVar11 = lVar4 * 0x18 + -0x10;
  lVar15 = 4;
  local_b8 = 1.0;
  dVar29 = 0.0;
  dVar32 = 0.0;
  dVar34 = 1.0;
  lVar7 = lVar4 * 0x10;
  lVar2 = lVar4 * 0x18;
  while( true ) {
    lVar12 = lVar2 + 0x20;
    lVar10 = lVar4 + 4;
    lVar8 = lVar7 + 0x20;
    if (lVar6 <= lVar15 + -2) break;
    dVar24 = w[lVar15];
    dVar26 = w[lVar15 + 1];
    dVar31 = w[lVar15 + 2];
    dVar33 = w[lVar15 + 3];
    dVar17 = a[lVar15 + -2];
    dVar20 = (a + lVar15 + -2)[1];
    dVar36 = a[lVar15];
    dVar37 = (a + lVar15)[1];
    pdVar1 = (double *)((long)a + lVar7 + 0x10);
    dVar35 = *pdVar1;
    dVar40 = pdVar1[1];
    dVar38 = dVar17 + dVar35;
    dVar39 = dVar20 + dVar40;
    dVar22 = a[lVar4 + 2];
    dVar23 = (a + lVar4 + 2)[1];
    pdVar1 = (double *)((long)a + lVar2 + 0x10);
    dVar30 = *pdVar1;
    dVar25 = pdVar1[1];
    dVar45 = dVar22 + dVar30;
    dVar47 = dVar23 + dVar25;
    dVar27 = *(double *)((long)a + lVar8);
    dVar3 = ((double *)((long)a + lVar8))[1];
    dVar43 = a[lVar10];
    dVar44 = (a + lVar10)[1];
    dVar18 = *(double *)((long)a + lVar12);
    dVar21 = ((double *)((long)a + lVar12))[1];
    a[lVar15 + -2] = dVar45 + dVar38;
    (a + lVar15 + -2)[1] = dVar47 + dVar39;
    dVar41 = dVar36 + dVar27;
    dVar42 = dVar37 + dVar3;
    dVar46 = dVar43 + dVar18;
    dVar48 = dVar44 + dVar21;
    a[lVar15] = dVar41 + dVar46;
    (a + lVar15)[1] = dVar42 + dVar48;
    a[lVar4 + 2] = dVar38 - dVar45;
    (a + lVar4 + 2)[1] = dVar39 - dVar47;
    a[lVar10] = dVar41 - dVar46;
    (a + lVar10)[1] = dVar42 - dVar48;
    dVar49 = (dVar34 + dVar24) * dVar19;
    dVar45 = (dVar32 + dVar26) * dVar19;
    dVar17 = dVar17 - dVar35;
    dVar20 = dVar20 - dVar40;
    dVar22 = dVar22 - dVar30;
    dVar23 = dVar23 - dVar25;
    dVar32 = dVar17 - dVar23;
    dVar34 = dVar20 - dVar22;
    dVar23 = dVar23 + dVar17;
    dVar22 = dVar22 + dVar20;
    dVar46 = (local_b8 + dVar31) * dVar28;
    dVar42 = (dVar29 + dVar33) * dVar28;
    pdVar1 = (double *)((long)a + lVar7 + 0x10);
    *pdVar1 = dVar49 * dVar32 + -dVar45 * dVar22;
    pdVar1[1] = dVar49 * dVar22 + dVar45 * dVar32;
    dVar36 = dVar36 - dVar27;
    dVar37 = dVar37 - dVar3;
    dVar43 = dVar43 - dVar18;
    dVar44 = dVar44 - dVar21;
    dVar29 = dVar36 - dVar44;
    dVar32 = dVar37 - dVar43;
    dVar44 = dVar44 + dVar36;
    dVar43 = dVar43 + dVar37;
    *(double *)((long)a + lVar8) = dVar24 * dVar29 + -dVar26 * dVar43;
    ((double *)((long)a + lVar8))[1] = dVar24 * dVar43 + dVar26 * dVar29;
    pdVar1 = (double *)((long)a + lVar2 + 0x10);
    *pdVar1 = dVar46 * dVar23 + dVar42 * dVar34;
    pdVar1[1] = dVar46 * dVar34 + -dVar42 * dVar23;
    *(double *)((long)a + lVar12) = dVar31 * dVar44 + dVar32 * dVar33;
    ((double *)((long)a + lVar12))[1] = dVar31 * dVar32 + dVar44 * -dVar33;
    dVar29 = a[lVar14 + -2];
    dVar32 = (a + lVar14 + -2)[1];
    dVar34 = a[lVar14];
    dVar17 = (a + lVar14)[1];
    dVar20 = *(double *)((long)a + lVar11);
    dVar36 = ((double *)((long)a + lVar11))[1];
    dVar37 = *(double *)((long)a + lVar13);
    dVar35 = ((double *)((long)a + lVar13))[1];
    dVar40 = *(double *)((long)a + lVar5);
    dVar22 = ((double *)((long)a + lVar5))[1];
    dVar44 = dVar34 + dVar20;
    dVar21 = dVar17 + dVar36;
    dVar39 = dVar37 + dVar40;
    dVar41 = dVar35 + dVar22;
    pdVar1 = (double *)((long)a + lVar11 + -0x10);
    dVar23 = *pdVar1;
    dVar30 = pdVar1[1];
    pdVar1 = (double *)((long)a + lVar13 + -0x10);
    dVar25 = *pdVar1;
    dVar27 = pdVar1[1];
    pdVar1 = (double *)((long)a + lVar5 + -0x10);
    dVar3 = *pdVar1;
    dVar43 = pdVar1[1];
    a[lVar14] = dVar39 + dVar44;
    (a + lVar14)[1] = dVar41 + dVar21;
    dVar47 = dVar29 + dVar23;
    dVar48 = dVar32 + dVar30;
    dVar18 = dVar25 + dVar3;
    dVar38 = dVar27 + dVar43;
    a[lVar14 + -2] = dVar47 + dVar18;
    (a + lVar14 + -2)[1] = dVar48 + dVar38;
    *(double *)((long)a + lVar13) = dVar44 - dVar39;
    ((double *)((long)a + lVar13))[1] = dVar21 - dVar41;
    pdVar1 = (double *)((long)a + lVar13 + -0x10);
    *pdVar1 = dVar47 - dVar18;
    pdVar1[1] = dVar48 - dVar38;
    dVar29 = dVar29 - dVar23;
    dVar32 = dVar32 - dVar30;
    dVar25 = dVar25 - dVar3;
    dVar27 = dVar27 - dVar43;
    dVar23 = dVar29 - dVar27;
    dVar30 = dVar32 - dVar25;
    dVar27 = dVar27 + dVar29;
    dVar25 = dVar25 + dVar32;
    pdVar1 = (double *)((long)a + lVar11 + -0x10);
    *pdVar1 = dVar26 * dVar23 + -dVar24 * dVar25;
    pdVar1[1] = dVar26 * dVar25 + dVar24 * dVar23;
    dVar34 = dVar34 - dVar20;
    dVar17 = dVar17 - dVar36;
    dVar37 = dVar37 - dVar40;
    dVar35 = dVar35 - dVar22;
    dVar29 = dVar34 - dVar35;
    dVar32 = dVar17 - dVar37;
    dVar35 = dVar35 + dVar34;
    dVar37 = dVar37 + dVar17;
    *(double *)((long)a + lVar11) = dVar45 * dVar29 + -dVar49 * dVar37;
    ((double *)((long)a + lVar11))[1] = dVar45 * dVar37 + dVar49 * dVar29;
    *(double *)((long)a + lVar5) = dVar42 * dVar35 + dVar46 * dVar32;
    ((double *)((long)a + lVar5))[1] = dVar42 * dVar32 + -dVar46 * dVar35;
    pdVar1 = (double *)((long)a + lVar5 + -0x10);
    *pdVar1 = dVar33 * dVar27 + dVar30 * dVar31;
    pdVar1[1] = dVar33 * dVar30 + dVar27 * -dVar31;
    lVar15 = lVar15 + 4;
    lVar14 = lVar14 + -4;
    lVar13 = lVar13 + -0x20;
    lVar5 = lVar5 + -0x20;
    lVar11 = lVar11 + -0x20;
    dVar29 = dVar33;
    dVar32 = dVar26;
    dVar34 = dVar24;
    lVar7 = lVar8;
    lVar4 = lVar10;
    lVar2 = lVar12;
    local_b8 = dVar31;
  }
  dVar22 = (dVar34 + dVar16) * dVar19;
  dVar19 = (dVar32 + dVar16) * dVar19;
  dVar40 = (local_b8 - dVar16) * dVar28;
  dVar28 = (dVar29 - dVar16) * dVar28;
  lVar7 = (long)(iVar9 * 5);
  lVar4 = (long)(iVar9 * 3);
  lVar14 = (long)(iVar9 * 7);
  dVar29 = a[lVar6];
  dVar32 = (a + lVar6)[1];
  dVar34 = a[lVar7 + -2];
  dVar24 = (a + lVar7 + -2)[1];
  dVar20 = dVar29 + dVar34;
  dVar36 = dVar32 + dVar24;
  dVar26 = a[lVar4 + -2];
  dVar31 = (a + lVar4 + -2)[1];
  dVar33 = a[lVar14 + -2];
  dVar17 = (a + lVar14 + -2)[1];
  dVar37 = dVar26 + dVar33;
  dVar35 = dVar31 + dVar17;
  a[lVar6] = dVar20 + dVar37;
  (a + lVar6)[1] = dVar36 + dVar35;
  a[lVar4 + -2] = dVar20 - dVar37;
  (a + lVar4 + -2)[1] = dVar36 - dVar35;
  dVar29 = dVar29 - dVar34;
  dVar32 = dVar32 - dVar24;
  dVar26 = dVar26 - dVar33;
  dVar31 = dVar31 - dVar17;
  dVar34 = dVar29 - dVar31;
  dVar24 = dVar32 - dVar26;
  dVar31 = dVar31 + dVar29;
  dVar26 = dVar26 + dVar32;
  a[lVar7 + -2] = dVar22 * dVar34 + -dVar19 * dVar26;
  (a + lVar7 + -2)[1] = dVar22 * dVar26 + dVar19 * dVar34;
  a[lVar14 + -2] = dVar40 * dVar31 + dVar28 * dVar24;
  (a + lVar14 + -2)[1] = dVar40 * dVar24 + -dVar28 * dVar31;
  dVar29 = a[iVar9];
  dVar32 = (a + iVar9)[1];
  dVar34 = a[lVar7];
  dVar24 = (a + lVar7)[1];
  dVar20 = dVar29 + dVar34;
  dVar36 = dVar32 + dVar24;
  dVar29 = dVar29 - dVar34;
  dVar32 = dVar32 - dVar24;
  dVar34 = a[lVar4];
  dVar24 = (a + lVar4)[1];
  dVar26 = a[lVar14];
  dVar31 = (a + lVar14)[1];
  dVar17 = dVar34 - dVar26;
  dVar33 = dVar24 - dVar31;
  dVar37 = dVar29 - dVar33;
  dVar33 = dVar33 + dVar29;
  dVar34 = dVar34 + dVar26;
  dVar24 = dVar24 + dVar31;
  a[iVar9] = dVar20 + dVar34;
  (a + iVar9)[1] = dVar36 + dVar24;
  a[lVar4] = dVar20 - dVar34;
  (a + lVar4)[1] = dVar36 - dVar24;
  dVar29 = dVar32 + dVar17;
  a[lVar7] = (dVar37 - dVar29) * dVar16;
  a[lVar7 + 1] = (dVar29 + dVar37) * dVar16;
  dVar32 = dVar32 - dVar17;
  a[lVar14] = (dVar32 + dVar33) * -dVar16;
  a[lVar14 + 1] = (dVar32 - dVar33) * -dVar16;
  dVar16 = a[(long)iVar9 + 2];
  dVar29 = (a + (long)iVar9 + 2)[1];
  dVar32 = a[lVar7 + 2];
  dVar34 = (a + lVar7 + 2)[1];
  dVar17 = dVar16 + dVar32;
  dVar20 = dVar29 + dVar34;
  dVar24 = a[lVar4 + 2];
  dVar26 = (a + lVar4 + 2)[1];
  dVar31 = a[lVar14 + 2];
  dVar33 = (a + lVar14 + 2)[1];
  dVar36 = dVar24 + dVar31;
  dVar37 = dVar26 + dVar33;
  a[(long)iVar9 + 2] = dVar17 + dVar36;
  (a + (long)iVar9 + 2)[1] = dVar20 + dVar37;
  a[lVar4 + 2] = dVar17 - dVar36;
  (a + lVar4 + 2)[1] = dVar20 - dVar37;
  dVar16 = dVar16 - dVar32;
  dVar29 = dVar29 - dVar34;
  dVar24 = dVar24 - dVar31;
  dVar26 = dVar26 - dVar33;
  dVar32 = dVar16 - dVar26;
  dVar34 = dVar29 - dVar24;
  dVar26 = dVar26 + dVar16;
  dVar24 = dVar24 + dVar29;
  a[lVar7 + 2] = dVar19 * dVar32 + -dVar22 * dVar24;
  (a + lVar7 + 2)[1] = dVar19 * dVar24 + dVar22 * dVar32;
  a[lVar14 + 2] = dVar28 * dVar26 + dVar40 * dVar34;
  (a + lVar14 + 2)[1] = dVar28 * dVar34 + -dVar40 * dVar26;
  return;
}

Assistant:

void cftf1st(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, m, mh;
  double wn4r, csc1, csc3, wk1r, wk1i, wk3r, wk3i,
    wd1r, wd1i, wd3r, wd3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
    y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i;

  mh = n >> 3;
  m = 2 * mh;
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] + a[j2];
  x0i = a[1] + a[j2 + 1];
  x1r = a[0] - a[j2];
  x1i = a[1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[0] = x0r + x2r;
  a[1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  a[j2] = x1r - x3i;
  a[j2 + 1] = x1i + x3r;
  a[j3] = x1r + x3i;
  a[j3 + 1] = x1i - x3r;
  wn4r = w[1];
  csc1 = w[2];
  csc3 = w[3];
  wd1r = 1;
  wd1i = 0;
  wd3r = 1;
  wd3i = 0;
  k = 0;
  for (j = 2; j < mh - 2; j += 4) {
    k += 4;
    wk1r = csc1 * (wd1r + w[k]);
    wk1i = csc1 * (wd1i + w[k + 1]);
    wk3r = csc3 * (wd3r + w[k + 2]);
    wk3i = csc3 * (wd3i + w[k + 3]);
    wd1r = w[k];
    wd1i = w[k + 1];
    wd3r = w[k + 2];
    wd3i = w[k + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] + a[j2];
    x0i = a[j + 1] + a[j2 + 1];
    x1r = a[j] - a[j2];
    x1i = a[j + 1] - a[j2 + 1];
    y0r = a[j + 2] + a[j2 + 2];
    y0i = a[j + 3] + a[j2 + 3];
    y1r = a[j + 2] - a[j2 + 2];
    y1i = a[j + 3] - a[j2 + 3];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 + 2] + a[j3 + 2];
    y2i = a[j1 + 3] + a[j3 + 3];
    y3r = a[j1 + 2] - a[j3 + 2];
    y3i = a[j1 + 3] - a[j3 + 3];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j + 2] = y0r + y2r;
    a[j + 3] = y0i + y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    a[j1 + 2] = y0r - y2r;
    a[j1 + 3] = y0i - y2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1r * x0r - wk1i * x0i;
    a[j2 + 1] = wk1r * x0i + wk1i * x0r;
    x0r = y1r - y3i;
    x0i = y1i + y3r;
    a[j2 + 2] = wd1r * x0r - wd1i * x0i;
    a[j2 + 3] = wd1r * x0i + wd1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3r * x0r + wk3i * x0i;
    a[j3 + 1] = wk3r * x0i - wk3i * x0r;
    x0r = y1r + y3i;
    x0i = y1i - y3r;
    a[j3 + 2] = wd3r * x0r + wd3i * x0i;
    a[j3 + 3] = wd3r * x0i - wd3i * x0r;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] + a[j2];
    x0i = a[j0 + 1] + a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = a[j0 + 1] - a[j2 + 1];
    y0r = a[j0 - 2] + a[j2 - 2];
    y0i = a[j0 - 1] + a[j2 - 1];
    y1r = a[j0 - 2] - a[j2 - 2];
    y1i = a[j0 - 1] - a[j2 - 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 - 2] + a[j3 - 2];
    y2i = a[j1 - 1] + a[j3 - 1];
    y3r = a[j1 - 2] - a[j3 - 2];
    y3i = a[j1 - 1] - a[j3 - 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i + x2i;
    a[j0 - 2] = y0r + y2r;
    a[j0 - 1] = y0i + y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    a[j1 - 2] = y0r - y2r;
    a[j1 - 1] = y0i - y2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 1] = wk1i * x0i + wk1r * x0r;
    x0r = y1r - y3i;
    x0i = y1i + y3r;
    a[j2 - 2] = wd1i * x0r - wd1r * x0i;
    a[j2 - 1] = wd1i * x0i + wd1r * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3i * x0r + wk3r * x0i;
    a[j3 + 1] = wk3i * x0i - wk3r * x0r;
    x0r = y1r + y3i;
    x0i = y1i - y3r;
    a[j3 - 2] = wd3i * x0r + wd3r * x0i;
    a[j3 - 1] = wd3i * x0i - wd3r * x0r;
  }
  wk1r = csc1 * (wd1r + wn4r);
  wk1i = csc1 * (wd1i + wn4r);
  wk3r = csc3 * (wd3r - wn4r);
  wk3i = csc3 * (wd3i - wn4r);
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0 - 2] + a[j2 - 2];
  x0i = a[j0 - 1] + a[j2 - 1];
  x1r = a[j0 - 2] - a[j2 - 2];
  x1i = a[j0 - 1] - a[j2 - 1];
  x2r = a[j1 - 2] + a[j3 - 2];
  x2i = a[j1 - 1] + a[j3 - 1];
  x3r = a[j1 - 2] - a[j3 - 2];
  x3i = a[j1 - 1] - a[j3 - 1];
  a[j0 - 2] = x0r + x2r;
  a[j0 - 1] = x0i + x2i;
  a[j1 - 2] = x0r - x2r;
  a[j1 - 1] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2 - 2] = wk1r * x0r - wk1i * x0i;
  a[j2 - 1] = wk1r * x0i + wk1i * x0r;
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3 - 2] = wk3r * x0r + wk3i * x0i;
  a[j3 - 1] = wk3r * x0i - wk3i * x0r;
  x0r = a[j0] + a[j2];
  x0i = a[j0 + 1] + a[j2 + 1];
  x1r = a[j0] - a[j2];
  x1i = a[j0 + 1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[j0] = x0r + x2r;
  a[j0 + 1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2] = wn4r * (x0r - x0i);
  a[j2 + 1] = wn4r * (x0i + x0r);
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3] = -wn4r * (x0r + x0i);
  a[j3 + 1] = -wn4r * (x0i - x0r);
  x0r = a[j0 + 2] + a[j2 + 2];
  x0i = a[j0 + 3] + a[j2 + 3];
  x1r = a[j0 + 2] - a[j2 + 2];
  x1i = a[j0 + 3] - a[j2 + 3];
  x2r = a[j1 + 2] + a[j3 + 2];
  x2i = a[j1 + 3] + a[j3 + 3];
  x3r = a[j1 + 2] - a[j3 + 2];
  x3i = a[j1 + 3] - a[j3 + 3];
  a[j0 + 2] = x0r + x2r;
  a[j0 + 3] = x0i + x2i;
  a[j1 + 2] = x0r - x2r;
  a[j1 + 3] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2 + 2] = wk1i * x0r - wk1r * x0i;
  a[j2 + 3] = wk1i * x0i + wk1r * x0r;
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3 + 2] = wk3i * x0r + wk3r * x0i;
  a[j3 + 3] = wk3i * x0i - wk3r * x0r;
}